

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
dlib::perspective_display::on_wheel_down(perspective_display *this,unsigned_long param_1)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *pmVar8;
  matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *pmVar9;
  long c;
  long lVar10;
  ulong num_pixels_;
  long r;
  ulong uVar11;
  vector<double,_3L> local_138;
  vector<double,_3L> local_118;
  vector<double,_3L> local_f8;
  camera_transform local_d8;
  
  lVar10 = *(this->super_drawable).lastx;
  lVar2 = *(this->super_drawable).lasty;
  lVar3 = (this->super_drawable).rect.l;
  lVar4 = (this->super_drawable).rect.t;
  lVar5 = (this->super_drawable).rect.r;
  lVar6 = (this->super_drawable).rect.b;
  if ((((lVar2 <= lVar6 && lVar10 <= lVar5) && (lVar4 <= lVar2 && lVar3 <= lVar10)) &&
      ((this->super_drawable).hidden == false)) && ((this->super_drawable).enabled == true)) {
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (local_f8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[2] -
         local_118.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2]) * 0.1 +
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_118.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (local_f8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[0] -
         local_118.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0]) * 0.1 +
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_f8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (local_f8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[1] -
         local_118.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1]) * 0.1 +
         local_f8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_138.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    uVar11 = 0;
    uVar7 = (lVar5 - lVar3) + 1;
    if (lVar5 < lVar3 || lVar6 < lVar4) {
      uVar7 = uVar11;
    }
    num_pixels_ = (lVar6 - lVar4) + 1;
    if (lVar5 < lVar3 || lVar6 < lVar4) {
      num_pixels_ = uVar11;
    }
    if (uVar7 <= num_pixels_) {
      num_pixels_ = uVar7;
    }
    camera_transform::camera_transform
              (&local_d8,&local_f8,&local_118,&local_138,(this->tform).camera_field_of_view,
               num_pixels_);
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_d8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_d8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_d8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_d8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_d8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_d8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_d8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_d8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_d8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_field_of_view = local_d8.camera_field_of_view;
    (this->tform).num_pixels = local_d8.num_pixels;
    pmVar8 = &(this->tform).proj;
    pmVar9 = &local_d8.proj;
    do {
      lVar10 = 0;
      do {
        dVar1 = (pmVar8->data).data[lVar10];
        (pmVar8->data).data[lVar10] = (pmVar9->data).data[lVar10];
        (pmVar9->data).data[lVar10] = dVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      uVar11 = uVar11 + 1;
      pmVar9 = (matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)((pmVar9->data).data + 3);
      pmVar8 = (matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)((pmVar8->data).data + 3);
    } while (uVar11 != 3);
    (this->tform).dist_scale = local_d8.dist_scale;
    (this->tform).width = local_d8.width;
    base_window::invalidate_rectangle
              (&((this->super_drawable).parent)->super_base_window,&(this->super_drawable).rect);
  }
  return;
}

Assistant:

void perspective_display::
    on_wheel_down (
        unsigned long //state
    )
    {
        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;

        const double alpha = 0.10;
        const vector<double> delta = alpha*(tform.get_camera_pos() - tform.get_camera_looking_at());
        tform = camera_transform(
            tform.get_camera_pos() + delta,
            tform.get_camera_looking_at(),
            tform.get_camera_up_direction(),
            tform.get_camera_field_of_view(),
            std::min(rect.width(),rect.height()));
        parent.invalidate_rectangle(rect);
    }